

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O3

aiNode * __thiscall Assimp::M3DImporter::findNode(M3DImporter *this,aiNode *pNode,aiString *name)

{
  uint uVar1;
  int iVar2;
  aiNode *paVar3;
  ulong __n;
  ulong uVar4;
  aiString local_434;
  
  if (pNode == (aiNode *)0x0) {
    __assert_fail("pNode != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x27a,"aiNode *Assimp::M3DImporter::findNode(aiNode *, aiString)");
  }
  if (this->mScene != (aiScene *)0x0) {
    uVar1 = (pNode->mName).length;
    if ((uVar1 != name->length) ||
       (iVar2 = bcmp((pNode->mName).data,name->data,(ulong)uVar1), iVar2 != 0)) {
      if (pNode->mNumChildren != 0) {
        uVar4 = 0;
        do {
          paVar3 = pNode->mChildren[uVar4];
          local_434.length = name->length;
          if (0x3fe < name->length) {
            local_434.length = 0x3ff;
          }
          __n = (ulong)local_434.length;
          memcpy(local_434.data,name->data,__n);
          local_434.data[__n] = '\0';
          paVar3 = findNode(this,paVar3,&local_434);
          if (paVar3 != (aiNode *)0x0) {
            return paVar3;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < pNode->mNumChildren);
      }
      pNode = (aiNode *)0x0;
    }
    return pNode;
  }
  __assert_fail("mScene != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                ,0x27b,"aiNode *Assimp::M3DImporter::findNode(aiNode *, aiString)");
}

Assistant:

aiNode *M3DImporter::findNode(aiNode *pNode, aiString name) {
	unsigned int i;

	ai_assert(pNode != nullptr);
	ai_assert(mScene != nullptr);

	if (pNode->mName == name)
		return pNode;
	for (i = 0; i < pNode->mNumChildren; i++) {
		aiNode *pChild = findNode(pNode->mChildren[i], name);
		if (pChild) return pChild;
	}
	return nullptr;
}